

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordedBasicPublisher.cpp
# Opt level: O0

int32_t anon_unknown.dwarf_1134d::positionBitsToShift(int32_t termBufferLength)

{
  IllegalArgumentException *this;
  char *pcVar1;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_10;
  int32_t local_c;
  int32_t termBufferLength_local;
  
  if (termBufferLength == 0x10000) {
    local_c = 0x10;
  }
  else if (termBufferLength == 0x20000) {
    local_c = 0x11;
  }
  else if (termBufferLength == 0x40000) {
    local_c = 0x12;
  }
  else if (termBufferLength == 0x80000) {
    local_c = 0x13;
  }
  else if (termBufferLength == 0x100000) {
    local_c = 0x14;
  }
  else if (termBufferLength == 0x200000) {
    local_c = 0x15;
  }
  else if (termBufferLength == 0x400000) {
    local_c = 0x16;
  }
  else if (termBufferLength == 0x800000) {
    local_c = 0x17;
  }
  else if (termBufferLength == 0x1000000) {
    local_c = 0x18;
  }
  else if (termBufferLength == 0x2000000) {
    local_c = 0x19;
  }
  else if (termBufferLength == 0x4000000) {
    local_c = 0x1a;
  }
  else if (termBufferLength == 0x8000000) {
    local_c = 0x1b;
  }
  else if (termBufferLength == 0x10000000) {
    local_c = 0x1c;
  }
  else if (termBufferLength == 0x20000000) {
    local_c = 0x1d;
  }
  else {
    if (termBufferLength != 0x40000000) {
      local_10 = termBufferLength;
      this = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_50,local_10);
      std::operator+(&local_30,"Invalid term buffer length: ",&local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,
                 "std::int32_t (anonymous namespace)::positionBitsToShift(std::int32_t)",&local_81);
      pcVar1 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/samples/RecordedBasicPublisher.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,pcVar1,&local_a9);
      aeron::util::IllegalArgumentException::IllegalArgumentException
                (this,&local_30,&local_80,&local_a8,0x4a);
      __cxa_throw(this,&aeron::util::IllegalArgumentException::typeinfo,
                  aeron::util::IllegalArgumentException::~IllegalArgumentException);
    }
    local_c = 0x1e;
  }
  return local_c;
}

Assistant:

std::int32_t positionBitsToShift(std::int32_t termBufferLength) {
    switch (termBufferLength) {
        case 64 * 1024:
            return 16;
        case 128 * 1024:
            return 17;
        case 256 * 1024:
            return 18;
        case 512 * 1024:
            return 19;
        case 1024 * 1024:
            return 20;
        case 2 * 1024 * 1024:
            return 21;
        case 4 * 1024 * 1024:
            return 22;
        case 8 * 1024 * 1024:
            return 23;
        case 16 * 1024 * 1024:
            return 24;
        case 32 * 1024 * 1024:
            return 25;
        case 64 * 1024 * 1024:
            return 26;
        case 128 * 1024 * 1024:
            return 27;
        case 256 * 1024 * 1024:
            return 28;
        case 512 * 1024 * 1024:
            return 29;
        case 1024 * 1024 * 1024:
            return 30;
    }

    throw util::IllegalArgumentException("Invalid term buffer length: " + std::to_string(termBufferLength), SOURCEINFO);
}